

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

timespec mario::detail::howMuchTimeFromNow(Timestamp when)

{
  Timestamp TVar1;
  ulong uVar2;
  timespec tVar3;
  
  TVar1 = Timestamp::now();
  uVar2 = 100;
  if (100 < when._microSecondsSinceEpoch - TVar1._microSecondsSinceEpoch) {
    uVar2 = when._microSecondsSinceEpoch - TVar1._microSecondsSinceEpoch;
  }
  tVar3.tv_sec = uVar2 / 1000000;
  tVar3.tv_nsec = (uVar2 % 1000000) * 1000;
  return tVar3;
}

Assistant:

struct timespec howMuchTimeFromNow(Timestamp when) {
    int64_t microseconds = when.microSecondsSinceEpoch()
        - Timestamp::now().microSecondsSinceEpoch();
    if (microseconds < 100) {
        microseconds = 100;
    }

    struct timespec ts;
    ts.tv_sec = static_cast<time_t>(microseconds / Timestamp::kMicroSecondsPerSecond);
    ts.tv_nsec = static_cast<long>((microseconds % Timestamp::kMicroSecondsPerSecond) * 1000);

    return ts;
}